

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

ssize_t uv__fs_write(uv_fs_t *req)

{
  int __fd;
  uint __count;
  long __offset;
  uv_buf_t *__iovec;
  int fd;
  off_t_conflict off;
  ssize_t r;
  size_t nbufs;
  iovec *bufs;
  uv_fs_t *req_local;
  
  __fd = req->file;
  __offset = req->off;
  __iovec = req->bufs;
  __count = req->nbufs;
  off = 0;
  if (__offset < 0) {
    if (__count == 1) {
      off = write(__fd,__iovec->base,__iovec->len);
    }
    else if (1 < __count) {
      off = writev(__fd,(iovec *)__iovec,__count);
    }
  }
  else if (__count == 1) {
    off = pwrite64(__fd,__iovec->base,__iovec->len,__offset);
  }
  else if (1 < __count) {
    off = pwritev64(__fd,(iovec *)__iovec,__count,__offset);
  }
  return off;
}

Assistant:

static ssize_t uv__fs_write(uv_fs_t* req) {
  const struct iovec* bufs;
  size_t nbufs;
  ssize_t r;
  off_t off;
  int fd;

  fd = req->file;
  off = req->off;
  bufs = (const struct iovec*) req->bufs;
  nbufs = req->nbufs;

  r = 0;
  if (off < 0) {
    if (nbufs == 1)
      r = write(fd, bufs->iov_base, bufs->iov_len);
    else if (nbufs > 1)
      r = writev(fd, bufs, nbufs);
  } else {
    if (nbufs == 1)
      r = pwrite(fd, bufs->iov_base, bufs->iov_len, off);
    else if (nbufs > 1)
      r = pwritev(fd, bufs, nbufs, off);
  }

  return r;
}